

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O1

ConditionCode arm::reverse_cond(ConditionCode cond)

{
  byte bVar1;
  
  bVar1 = cond - UnsignedGe;
  if ((bVar1 < 0xd) && ((0x1f85U >> (bVar1 & 0x1f) & 1) != 0)) {
    cond = (&DAT_001bd5b8)[(uint)bVar1];
  }
  return cond;
}

Assistant:

ConditionCode reverse_cond(ConditionCode cond) {
  switch (cond) {
    case ConditionCode::Equal:
    case ConditionCode::NotEqual:
    case ConditionCode::CarrySet:
    case ConditionCode::CarryClear:
    case ConditionCode::MinusOrNegative:
    case ConditionCode::PositiveOrZero:
    case ConditionCode::Overflow:
    case ConditionCode::NoOverflow:
    case ConditionCode::Always:
      return cond;

    case ConditionCode::UnsignedGe:
      return ConditionCode::UnsignedLe;
    case ConditionCode::UnsignedLt:
      return ConditionCode::UnsignedGt;
    case ConditionCode::UnsignedGt:
      return ConditionCode::UnsignedLt;
    case ConditionCode::UnsignedLe:
      return ConditionCode::UnsignedGe;

    case ConditionCode::Ge:
      return ConditionCode::Le;
    case ConditionCode::Lt:
      return ConditionCode::Gt;
    case ConditionCode::Gt:
      return ConditionCode::Lt;
    case ConditionCode::Le:
      return ConditionCode::Ge;
    default:
      return cond;
  }
}